

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Transponder.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::IFF_Layer3Transponder::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IFF_Layer3Transponder *this)

{
  pointer pKVar1;
  ostream *poVar2;
  pointer pKVar3;
  KStringStream ss;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"IFF Layer 3 Transponder\n",0x18);
  LayerHeader::GetAsString_abi_cxx11_(&local_218,(LayerHeader *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Reporting Simulation: ",0x16);
  SimulationIdentifier::GetAsString_abi_cxx11_(&local_1d8,&(this->super_IFF_Layer3).m_RptSim);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Basic Data: ",0xc);
  Mode5TransponderBasicData::GetAsString_abi_cxx11_(&local_1f8,&this->m_BasicData);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Num IFF Records: ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nIFF Records:\n",0xe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  pKVar1 = (this->super_IFF_Layer3).m_vStdVarRecs.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->super_IFF_Layer3).m_vStdVarRecs.
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_Layer3Transponder::GetAsString() const
{
    KStringStream ss;

    ss << "IFF Layer 3 Transponder\n"
        << LayerHeader::GetAsString()
        << "Reporting Simulation: " << m_RptSim.GetAsString()
        << "Basic Data: "           << m_BasicData.GetAsString() 
        << "Num IFF Records: "      << m_ui16NumIffRecs 
        << "\nIFF Records:\n";

    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }	

    return ss.str();
}